

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserEvent.h
# Opt level: O0

void __thiscall
UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~UserEvent(UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  
  ~UserEvent(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~UserEvent() {}